

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_aarch64.c
# Opt level: O2

uc_err reg_write_aarch64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uint32_t uVar1;
  uint uVar2;
  ARMCPRegInfo_conflict *pAVar3;
  long lVar4;
  CPWriteFn_conflict *pCVar5;
  uc_err uVar6;
  uint uVar7;
  
  uVar2 = regid - 0x7c;
  if (0x1f < regid - 0xe4) {
    uVar2 = regid;
  }
  if (uVar2 - 199 < 0x1d) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar2 - 199) * 8 + 0x40) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 0xa8 < 0x1f) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    *(undefined4 *)((long)_env + (ulong)(uVar2 - 0xa8) * 8 + 0x40) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 0x68 < 0x20) {
    if (*size < 0x10) {
      return UC_ERR_OVERFLOW;
    }
    *size = 0x10;
    lVar4 = (ulong)(uVar2 - 0x68) * 0x100;
    *(undefined8 *)((long)_env + lVar4 + 0xc10) = *value;
    *(undefined8 *)((long)_env + lVar4 + 0xc18) = *(undefined8 *)((long)value + 8);
    goto LAB_0057672e;
  }
  if (uVar2 - 0x28 < 0x20) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x28) * 0x100 + 0xc10) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 0x88 < 0x20) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    *(undefined4 *)((long)_env + (ulong)(uVar2 - 0x88) * 0x100 + 0xc10) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 0x48 < 0x20) {
    if (*size < 2) {
      return UC_ERR_OVERFLOW;
    }
    *size = 2;
    *(undefined2 *)((long)_env + (ulong)(uVar2 - 0x48) * 0x100 + 0xc10) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 8 < 0x20) {
    if (*size == 0) {
      return UC_ERR_OVERFLOW;
    }
    *size = 1;
    *(undefined1 *)((long)_env + (ulong)(uVar2 - 8) * 0x100 + 0xc10) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 0x10a < 4) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x10a) * 8 + 0x238) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 0x10e < 4) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x10e) * 8 + 600) = *value;
    goto LAB_0057672e;
  }
  if ((uVar2 & 0xfffffffc) == 0x118) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x118) * 8 + 0x418) = *value;
    goto LAB_0057672e;
  }
  if ((uVar2 & 0xfffffffc) == 0x114) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x114) * 8 + 0x3d8) = *value;
    goto LAB_0057672e;
  }
  if (uVar2 - 0x11e < 4) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x11e) * 8 + 0x4c0) = *value;
    goto LAB_0057672e;
  }
  uVar6 = UC_ERR_ARG;
  switch(uVar2) {
  case 0x104:
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + 0x140) = *value;
    *setpc = 1;
    break;
  case 0x105:
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    *(ulong *)((long)_env + 0x2c0) = (ulong)*value;
    break;
  case 0x106:
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + 0x510) = *value;
    break;
  case 0x107:
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + 0x548) = *value;
    break;
  case 0x108:
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + 0x518) = *value;
    break;
  case 0x109:
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    uVar2 = *value;
    *(uint *)((long)_env + 0x214) = ~uVar2 & 0x40000000;
    *(uint *)((long)_env + 0x210) = uVar2;
    *(uint *)((long)_env + 0x208) = uVar2 >> 0x1d & 1;
    *(uint *)((long)_env + 0x20c) = uVar2 * 8 & 0x80000000;
    *(ulong *)((long)_env + 0x230) = (ulong)(uVar2 & 0x3c0);
    *(uint *)((long)_env + 0x228) = uVar2 >> 10 & 3;
    *(uint *)((long)_env + 0x148) = uVar2 & 0xffff03f;
    break;
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x111:
    goto switchD_0057675e_caseD_11e;
  case 0x112:
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + 0x308) = *value;
    break;
  case 0x113:
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + 0x328) = *value;
    break;
  default:
    switch(uVar2) {
    case 0x11c:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x450) = *value;
      break;
    case 0x11d:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x4a8) = *value;
      break;
    case 0x11e:
    case 0x11f:
    case 0x120:
    case 0x121:
      goto switchD_0057675e_caseD_11e;
    case 0x122:
      if (*size < 0x20) {
        return UC_ERR_OVERFLOW;
      }
      *size = 0x20;
      pAVar3 = get_arm_cp_reginfo_aarch64
                         (*(GHashTable **)
                           (*(long *)(*(long *)((long)_env + 0x31b8) + 0x1a0) + 0xd510),
                          *(int *)((long)value + 4) << 3 | *value << 7 |
                          *(int *)((long)value + 0xc) << 0xb | *(int *)((long)value + 8) << 0xe |
                          *(uint *)((long)value + 0x10) | 0x10130000);
      if (pAVar3 == (ARMCPRegInfo_conflict *)0x0) {
        uVar6 = UC_ERR_ARG;
      }
      else {
        pCVar5 = pAVar3->raw_writefn;
        if ((pCVar5 == (CPWriteFn_conflict *)0x0) &&
           (pCVar5 = pAVar3->writefn, pCVar5 == (CPWriteFn_conflict *)0x0)) {
          if ((pAVar3->state == 1) || ((pAVar3->type & 4) != 0)) {
            *(undefined8 *)((long)_env + pAVar3->fieldoffset) = *(undefined8 *)((long)value + 0x18);
          }
          else {
            *(undefined4 *)((long)_env + pAVar3->fieldoffset) = *(undefined4 *)((long)value + 0x18);
          }
        }
        else {
          (*pCVar5)((CPUARMState_conflict *)_env,pAVar3,*(uint64_t *)((long)value + 0x18));
        }
        uVar6 = UC_ERR_OK;
      }
      arm_rebuild_hflags_aarch64((CPUARMState_conflict *)_env);
      return uVar6;
    case 0x123:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      uVar7 = *value & 0x7ff9f00;
      uVar1 = vfp_get_fpscr_aarch64((CPUARMState_conflict *)_env);
      uVar2 = uVar1 & 0xf80060ff;
      goto LAB_00576a20;
    case 0x124:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      uVar7 = *value & 0xf800009f;
      uVar1 = vfp_get_fpscr_aarch64((CPUARMState_conflict *)_env);
      uVar2 = uVar1 & 0x7ffff60;
LAB_00576a20:
      vfp_set_fpscr_aarch64((CPUARMState_conflict *)_env,uVar7 | uVar2);
      break;
    default:
      switch(uVar2) {
      case 1:
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        *(undefined8 *)((long)_env + 0x128) = *value;
        break;
      case 2:
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        *(undefined8 *)((long)_env + 0x130) = *value;
        break;
      case 3:
        if (*size < 4) {
          return UC_ERR_OVERFLOW;
        }
        *size = 4;
        cpsr_write_aarch64((CPUARMState_conflict *)_env,*value,0xf0000000,CPSRWriteRaw);
        break;
      case 4:
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        *(undefined8 *)((long)_env + 0x138) = *value;
        break;
      default:
        goto switchD_0057675e_caseD_11e;
      }
    }
  }
LAB_0057672e:
  uVar6 = UC_ERR_OK;
switchD_0057675e_caseD_11e:
  return uVar6;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM64_REG_V0 && regid <= UC_ARM64_REG_V31) {
        regid += UC_ARM64_REG_Q0 - UC_ARM64_REG_V0;
    }
    if (regid >= UC_ARM64_REG_X0 && regid <= UC_ARM64_REG_X28) {
        CHECK_REG_TYPE(uint64_t);
        env->xregs[regid - UC_ARM64_REG_X0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_W0 && regid <= UC_ARM64_REG_W30) {
        CHECK_REG_TYPE(uint32_t);
        WRITE_DWORD(env->xregs[regid - UC_ARM64_REG_W0], *(uint32_t *)value);
    } else if (regid >= UC_ARM64_REG_Q0 && regid <= UC_ARM64_REG_Q31) {
        CHECK_REG_TYPE(float64[2]);
        float64 *src = (float64 *)value;
        uint32_t reg_index = regid - UC_ARM64_REG_Q0;
        env->vfp.zregs[reg_index].d[0] = src[0];
        env->vfp.zregs[reg_index].d[1] = src[1];
    } else if (regid >= UC_ARM64_REG_D0 && regid <= UC_ARM64_REG_D31) {
        CHECK_REG_TYPE(float64);
        env->vfp.zregs[regid - UC_ARM64_REG_D0].d[0] = *(float64 *)value;
    } else if (regid >= UC_ARM64_REG_S0 && regid <= UC_ARM64_REG_S31) {
        CHECK_REG_TYPE(int32_t);
        WRITE_DWORD(env->vfp.zregs[regid - UC_ARM64_REG_S0].d[0],
                    *(int32_t *)value);
    } else if (regid >= UC_ARM64_REG_H0 && regid <= UC_ARM64_REG_H31) {
        CHECK_REG_TYPE(int16_t);
        WRITE_WORD(env->vfp.zregs[regid - UC_ARM64_REG_H0].d[0],
                   *(int16_t *)value);
    } else if (regid >= UC_ARM64_REG_B0 && regid <= UC_ARM64_REG_B31) {
        CHECK_REG_TYPE(int8_t);
        WRITE_BYTE_L(env->vfp.zregs[regid - UC_ARM64_REG_B0].d[0],
                     *(int8_t *)value);
    } else if (regid >= UC_ARM64_REG_ELR_EL0 && regid <= UC_ARM64_REG_ELR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->elr_el[regid - UC_ARM64_REG_ELR_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_SP_EL0 && regid <= UC_ARM64_REG_SP_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->sp_el[regid - UC_ARM64_REG_SP_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_ESR_EL0 && regid <= UC_ARM64_REG_ESR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->cp15.esr_el[regid - UC_ARM64_REG_ESR_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_FAR_EL0 && regid <= UC_ARM64_REG_FAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->cp15.far_el[regid - UC_ARM64_REG_FAR_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_VBAR_EL0 &&
               regid <= UC_ARM64_REG_VBAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->cp15.vbar_el[regid - UC_ARM64_REG_VBAR_EL0] = *(uint64_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_ARM64_REG_CPACR_EL1:
            CHECK_REG_TYPE(uint32_t);
            env->cp15.cpacr_el1 = *(uint32_t *)value;
            break;
        case UC_ARM64_REG_TPIDR_EL0:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.tpidr_el[0] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_TPIDRRO_EL0:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.tpidrro_el[0] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_TPIDR_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.tpidr_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_X29:
            CHECK_REG_TYPE(uint64_t);
            env->xregs[29] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_X30:
            CHECK_REG_TYPE(uint64_t);
            env->xregs[30] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_PC:
            CHECK_REG_TYPE(uint64_t);
            env->pc = *(uint64_t *)value;
            *setpc = 1;
            break;
        case UC_ARM64_REG_SP:
            CHECK_REG_TYPE(uint64_t);
            env->xregs[31] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_NZCV:
            CHECK_REG_TYPE(uint32_t);
            cpsr_write(env, *(uint32_t *)value, CPSR_NZCV, CPSRWriteRaw);
            break;
        case UC_ARM64_REG_PSTATE:
            CHECK_REG_TYPE(uint32_t);
            pstate_write(env, *(uint32_t *)value);
            break;
        case UC_ARM64_REG_TTBR0_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.ttbr0_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_TTBR1_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.ttbr1_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_PAR_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.par_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_MAIR_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.mair_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm64_cp_reg);
            ret = write_cp_reg(env, (uc_arm64_cp_reg *)value);
            arm_rebuild_hflags(env);
            break;
        case UC_ARM64_REG_FPCR:
            CHECK_REG_TYPE(uint32_t);
            vfp_set_fpcr(env, *(uint32_t *)value);
            break;
        case UC_ARM64_REG_FPSR:
            CHECK_REG_TYPE(uint32_t);
            vfp_set_fpsr(env, *(uint32_t *)value);
            break;
        }
    }

    return ret;
}